

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *
deqp::gles31::Functional::anon_unknown_0::getLevelAccesses
          (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
           *__return_storage_ptr__,
          vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
          *data,ImageInfo *info)

{
  byte bVar1;
  undefined8 uVar2;
  int i;
  int height;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *pvVar3;
  long lVar4;
  int width;
  int iVar5;
  pointer pAVar6;
  long lVar7;
  IVec3 size_1;
  IVec3 size;
  TextureFormat format;
  int local_88 [4];
  undefined8 local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  TextureFormat local_60;
  ConstPixelBufferAccess local_58;
  
  local_60 = glu::mapGLInternalFormat(info->m_format);
  local_6c = (info->m_size).m_data[2];
  local_70 = local_6c;
  local_78 = *(undefined8 *)(info->m_size).m_data;
  uVar2 = local_78;
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pAVar6 = (data->
           super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
           ((ulong)((long)(data->
                          super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6) >> 4);
  if (0 < (int)pvVar3) {
    local_64 = (int)local_78;
    local_78._4_4_ = (int)((ulong)local_78 >> 0x20);
    local_68 = local_78._4_4_;
    lVar7 = 0;
    local_78 = uVar2;
    do {
      local_88[2] = 0;
      local_88[0] = 0;
      local_88[1] = 0;
      bVar1 = (byte)lVar7;
      if (info->m_target == 0x8c1a) {
        width = local_64 >> (bVar1 & 0x1f);
        if (width < 2) {
          width = 1;
        }
        height = local_68 >> (bVar1 & 0x1f);
        iVar5 = local_6c;
        if (height < 2) {
          height = 1;
        }
      }
      else {
        lVar4 = 0;
        do {
          iVar5 = *(int *)((long)&local_78 + lVar4 * 4) >> (bVar1 & 0x1f);
          if (iVar5 < 2) {
            iVar5 = 1;
          }
          local_88[lVar4] = iVar5;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        iVar5 = local_88[2];
        height = local_88[1];
        width = local_88[0];
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_58,&local_60,width,height,iVar5,pAVar6[lVar7].m_ptr);
      std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      emplace_back<tcu::ConstPixelBufferAccess>(__return_storage_ptr__,&local_58);
      lVar7 = lVar7 + 1;
      pAVar6 = (data->
               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
               (long)(int)((ulong)((long)(data->
                                         super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6)
                          >> 4);
    } while (lVar7 < (long)pvVar3);
  }
  return pvVar3;
}

Assistant:

vector<tcu::ConstPixelBufferAccess> getLevelAccesses (const vector<ArrayBuffer<deUint8> >& data, const ImageInfo& info)
{
	const tcu::TextureFormat			format	= glu::mapGLInternalFormat(info.getFormat());
	const IVec3							size	= info.getSize();

	vector<tcu::ConstPixelBufferAccess>	result;

	DE_ASSERT((int)data.size() == getLevelCount(info));

	for (int level = 0; level < (int)data.size(); level++)
	{
		const IVec3 levelSize = getLevelSize(info.getTarget(), size, level);

		result.push_back(tcu::ConstPixelBufferAccess(format, levelSize.x(), levelSize.y(), levelSize.z(), data[level].getPtr()));
	}

	return result;
}